

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graphics.cpp
# Opt level: O0

float nite::getGeneralScale(void)

{
  float bs;
  float cs;
  Vec2 ns;
  
  if ((generalScale == -1.0) && (!NAN(generalScale))) {
    getSize();
    generalScale = ((bs + cs) * 0.5) / 1000.0;
  }
  return generalScale;
}

Assistant:

float nite::getGeneralScale(){
	if(generalScale == -1.0f){
	  auto ns = nite::getSize();
	  float cs = (ns.x + ns.y) * 0.5f;
	  float bs = (1280.0f + 720.0f) * 0.5f;
	  generalScale = cs / bs;
	}
	return generalScale;
}